

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

extent_t * arena_bin_slabs_nonfull_tryget(bin_t *bin)

{
  long in_RDI;
  extent_t *slab;
  extent_heap_t *in_stack_000000b8;
  undefined8 local_8;
  
  local_8 = extent_heap_remove_first(in_stack_000000b8);
  if (local_8 == (extent_t *)0x0) {
    local_8 = (extent_t *)0x0;
  }
  else {
    *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + 1;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xd0) + -1;
  }
  return local_8;
}

Assistant:

static extent_t *
arena_bin_slabs_nonfull_tryget(bin_t *bin) {
	extent_t *slab = extent_heap_remove_first(&bin->slabs_nonfull);
	if (slab == NULL) {
		return NULL;
	}
	if (config_stats) {
		bin->stats.reslabs++;
		bin->stats.nonfull_slabs--;
	}
	return slab;
}